

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
__thiscall ninx::parser::Parser::parse_statement(Parser *this)

{
  TokenReader *this_00;
  pointer pcVar1;
  char cVar2;
  int iVar3;
  Token *pTVar4;
  Text *this_01;
  Limiter *this_02;
  iterator iVar5;
  Variable *this_03;
  string *psVar6;
  VariableRead *this_04;
  TextElement *this_05;
  long in_RSI;
  char limiter;
  string name;
  _Head_base<0UL,_ninx::parser::element::Expression_*,_false> local_60;
  undefined1 local_58 [40];
  
  this_00 = (TokenReader *)(in_RSI + 0x20);
  pTVar4 = TokenReader::get_token(this_00);
  if (pTVar4 == (Token *)0x0) {
switchD_0014770c_caseD_2:
    (this->origin)._M_dataplus._M_p = (pointer)0x0;
    return (unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
            )this;
  }
  iVar3 = (*pTVar4->_vptr_Token[2])(pTVar4);
  switch(iVar3) {
  case 0:
    this_01 = (Text *)__dynamic_cast(pTVar4,&lexer::token::Token::typeinfo,
                                     &lexer::token::Text::typeinfo,0);
    psVar6 = lexer::token::Text::get_text_abi_cxx11_(this_01);
    this_05 = (TextElement *)operator_new(0x38);
    element::TextElement::TextElement(this_05,psVar6);
    goto LAB_00147749;
  case 1:
    this_02 = (Limiter *)
              __dynamic_cast(pTVar4,&lexer::token::Token::typeinfo,&lexer::token::Limiter::typeinfo,
                             0);
    cVar2 = lexer::token::Limiter::get_limiter(this_02);
    local_60._M_head_impl._0_1_ = cVar2;
    iVar5 = std::
            _Hashtable<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)(in_RSI + 0x30),(key_type_conflict1 *)&local_60);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
        ._M_cur != (__node_type *)0x0) {
      TokenReader::seek_previous(this_00);
      parse_operator_call((Parser *)local_58,(char)in_RSI);
      break;
    }
    local_58._0_8_ = local_58 + 0x10;
    std::__cxx11::string::_M_construct((ulong)local_58,'\x01');
    this_05 = (TextElement *)operator_new(0x38);
    element::TextElement::TextElement(this_05,(string *)local_58);
    if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
      operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
    }
LAB_00147749:
    (this->origin)._M_dataplus._M_p = (pointer)this_05;
    return (unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
            )this;
  default:
    goto switchD_0014770c_caseD_2;
  case 3:
    this_03 = (Variable *)
              __dynamic_cast(pTVar4,&lexer::token::Token::typeinfo,&lexer::token::Variable::typeinfo
                             ,0);
    psVar6 = lexer::token::Variable::get_name_abi_cxx11_(this_03);
    pcVar1 = (psVar6->_M_dataplus)._M_p;
    local_58._0_8_ = local_58 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,pcVar1,pcVar1 + psVar6->_M_string_length);
    iVar3 = TokenReader::check_limiter(this_00,'=');
    if (iVar3 == 1) {
      TokenReader::get_token(this_00);
      parse_level_3_expression((Parser *)(local_58 + 0x20));
      this_04 = (VariableRead *)operator_new(0x40);
      local_60._M_head_impl = (Expression *)local_58._32_8_;
      element::Assignment::Assignment
                ((Assignment *)this_04,(string *)local_58,
                 (unique_ptr<ninx::parser::element::Expression,_std::default_delete<ninx::parser::element::Expression>_>
                  *)&local_60);
      if (local_60._M_head_impl != (Expression *)0x0) {
        (*(code *)(((_Vector_base<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>,_std::allocator<std::unique_ptr<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>_>_>
                     *)&(local_60._M_head_impl)->super_Statement)->_M_impl).super__Vector_impl_data.
                  _M_start[1]._M_t.
                  super___uniq_ptr_impl<ninx::lexer::token::Token,_std::default_delete<ninx::lexer::token::Token>_>
                  ._M_t)();
      }
    }
    else {
      iVar3 = lexer::token::Variable::get_trailing_spaces(this_03);
      this_04 = (VariableRead *)operator_new(0x40);
      element::VariableRead::VariableRead(this_04,(string *)local_58,iVar3);
    }
    (this->origin)._M_dataplus._M_p = (pointer)this_04;
    if ((undefined1 *)local_58._0_8_ == local_58 + 0x10) {
      return (unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
              )this;
    }
    operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
    return (unique_ptr<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>_>
            )this;
  case 4:
    TokenReader::seek_previous(this_00);
    parse_function_call((Parser *)local_58);
    break;
  case 5:
    parse_function_definition((Parser *)local_58);
    break;
  case 6:
    parse_operator_definition((Parser *)local_58);
    break;
  case 7:
    TokenReader::seek_previous(this_00);
    parse_if_statement((Parser *)local_58);
    break;
  case 10:
    TokenReader::seek_previous(this_00);
    parse_for_statement((Parser *)local_58);
  }
  (this->origin)._M_dataplus._M_p = (pointer)local_58._0_8_;
  return (__uniq_ptr_data<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>,_true,_true>
          )(__uniq_ptr_data<ninx::parser::element::Statement,_std::default_delete<ninx::parser::element::Statement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Statement> ninx::parser::Parser::parse_statement() {
    Token *token{reader.get_token()};

    if (token) {
        switch (token->get_type()) {
            case Type::FUNCDEF: {
                return parse_function_definition();
            }
            case Type::OPDEF: {
                return parse_operator_definition();
            }
            case Type::VARIABLE: {
                auto variable_token {dynamic_cast<ninx::lexer::token::Variable *>(token)};
                // Get the variable name
                auto name{variable_token->get_name()};

                // Determine if the variable is used in an assignment by peeking the next
                // token and checking if it is a limiter equal to =
                if (reader.check_limiter('=') == 1) {  // Assignment
                    // Skip the = limiter
                    reader.get_token();

                    auto value = parse_expression();

                    auto element = std::make_unique<ninx::parser::element::Assignment>(name, std::move(value));
                    return element;
                } else {  // Variable used as value
                    auto element = std::make_unique<ninx::parser::element::VariableRead>(name, variable_token->get_trailing_spaces());
                    return element;
                }
            }
            case Type::LIMITER: {
                auto limiter_token { dynamic_cast<ninx::lexer::token::Limiter *>(token) };
                char limiter {limiter_token->get_limiter()};

                if (operators.find(limiter) != operators.end()) {  // Operator found, parse it
                    reader.seek_previous();
                    return parse_operator_call(limiter);
                }else{  // Limiter not registered, default to a text element
                    auto element = std::make_unique<TextElement>(std::string(1, limiter));
                    return element;
                }
            }
            case Type::FUNCNAME: {
                reader.seek_previous();  // Seek to the previous token to make the function able to read it again
                return parse_function_call();
            }
            case Type::IF: {
                reader.seek_previous();  // Rewind the if block
                return parse_if_statement();
            }
            case Type::FOR: {
                reader.seek_previous();  // Rewind the for block
                return parse_for_statement();
            }
            case Type::TEXT: {
                auto element = std::make_unique<TextElement>(
                        dynamic_cast<ninx::lexer::token::Text *>(token)->get_text());
                return element;
            }
        }

        // TODO: throw parse exception for unexpected token
    }

    // End of the document
    return nullptr;
}